

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-multicast-ttl.c
# Opt level: O3

int run_test_udp_multicast_ttl(void)

{
  int iVar1;
  undefined8 uVar2;
  bool bVar3;
  uv_udp_t *puVar4;
  code **ppcVar5;
  int64_t eval_b_4;
  int64_t eval_b_5;
  int64_t eval_b;
  sockaddr_in addr;
  uv_udp_send_t req;
  code *apcStack_1a8 [2];
  undefined8 uStack_198;
  undefined1 auStack_190 [16];
  undefined1 local_180 [16];
  uv__queue local_170;
  undefined1 local_160 [16];
  uv_handle_t *local_150 [41];
  
  auStack_190._0_8_ = (void *)0x1ded65;
  uVar2 = uv_default_loop();
  auStack_190._0_8_ = (void *)0x1ded74;
  iVar1 = uv_udp_init(uVar2,&server);
  local_150[0] = (uv_handle_t *)(long)iVar1;
  local_170.next = (uv__queue *)0x0;
  if (local_150[0] == (uv_handle_t *)0x0) {
    auStack_190._0_8_ = (void *)0x1deda7;
    iVar1 = uv_ip4_addr("0.0.0.0",0,local_160);
    local_150[0] = (uv_handle_t *)(long)iVar1;
    local_170.next = (uv__queue *)0x0;
    if (local_150[0] != (uv_handle_t *)0x0) goto LAB_001defd5;
    auStack_190._0_8_ = (void *)0x1dedda;
    iVar1 = uv_udp_bind(&server,local_160,0);
    local_150[0] = (uv_handle_t *)(long)iVar1;
    local_170.next = (uv__queue *)0x0;
    if (local_150[0] != (uv_handle_t *)0x0) goto LAB_001defe4;
    auStack_190._0_8_ = (void *)0x1dee0b;
    iVar1 = uv_udp_set_multicast_ttl(&server,0x20);
    local_150[0] = (uv_handle_t *)(long)iVar1;
    local_170.next = (uv__queue *)0x0;
    if (local_150[0] != (uv_handle_t *)0x0) goto LAB_001deff3;
    auStack_190._0_8_ = (void *)0x1dee3c;
    local_170 = (uv__queue)uv_buf_init("PING",4);
    auStack_190._0_8_ = (void *)0x1dee5c;
    iVar1 = uv_ip4_addr("239.255.0.1",0x23a3,local_160);
    local_150[0] = (uv_handle_t *)(long)iVar1;
    local_180._0_8_ = (uv_loop_t *)0x0;
    if (local_150[0] != (uv_handle_t *)0x0) goto LAB_001df002;
    auStack_190._0_8_ = (void *)0x1deea3;
    iVar1 = uv_udp_send(local_150,&server,&local_170,1,local_160,sv_send_cb);
    local_180._0_8_ = SEXT48(iVar1);
    local_180._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)local_180._0_8_ != (uv_loop_t *)0x0) goto LAB_001df011;
    local_180._0_8_ = SEXT48(close_cb_called);
    local_180._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)local_180._0_8_ != (uv_loop_t *)0x0) goto LAB_001df020;
    local_180._0_8_ = SEXT48(sv_send_cb_called);
    local_180._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)local_180._0_8_ != (uv_loop_t *)0x0) goto LAB_001df02f;
    auStack_190._0_8_ = (void *)0x1def12;
    uVar2 = uv_default_loop();
    auStack_190._0_8_ = (void *)0x1def1c;
    uv_run(uVar2,0);
    local_180._0_8_ = (uv_loop_t *)0x1;
    local_180._8_8_ = SEXT48(sv_send_cb_called);
    if ((uv_loop_t *)local_180._8_8_ != (uv_loop_t *)0x1) goto LAB_001df03e;
    local_180._0_8_ = (uv_loop_t *)0x1;
    local_180._8_8_ = SEXT48(close_cb_called);
    if ((uv_loop_t *)local_180._8_8_ != (uv_loop_t *)0x1) goto LAB_001df04d;
    auStack_190._0_8_ = (void *)0x1def6b;
    uVar2 = uv_default_loop();
    auStack_190._0_8_ = (void *)0x1def7f;
    uv_walk(uVar2,close_walk_cb,0);
    auStack_190._0_8_ = (void *)0x1def89;
    uv_run(uVar2,0);
    local_180._0_8_ = (uv_loop_t *)0x0;
    auStack_190._0_8_ = (void *)0x1def97;
    uVar2 = uv_default_loop();
    auStack_190._0_8_ = (void *)0x1def9f;
    iVar1 = uv_loop_close(uVar2);
    local_180._8_8_ = SEXT48(iVar1);
    if (local_180._0_8_ == local_180._8_8_) {
      auStack_190._0_8_ = (void *)0x1defbb;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    auStack_190._0_8_ = (void *)0x1defd5;
    run_test_udp_multicast_ttl_cold_1();
LAB_001defd5:
    auStack_190._0_8_ = (void *)0x1defe4;
    run_test_udp_multicast_ttl_cold_2();
LAB_001defe4:
    auStack_190._0_8_ = (void *)0x1deff3;
    run_test_udp_multicast_ttl_cold_3();
LAB_001deff3:
    auStack_190._0_8_ = (void *)0x1df002;
    run_test_udp_multicast_ttl_cold_4();
LAB_001df002:
    auStack_190._0_8_ = (void *)0x1df011;
    run_test_udp_multicast_ttl_cold_5();
LAB_001df011:
    auStack_190._0_8_ = (void *)0x1df020;
    run_test_udp_multicast_ttl_cold_6();
LAB_001df020:
    auStack_190._0_8_ = (void *)0x1df02f;
    run_test_udp_multicast_ttl_cold_7();
LAB_001df02f:
    auStack_190._0_8_ = (void *)0x1df03e;
    run_test_udp_multicast_ttl_cold_8();
LAB_001df03e:
    auStack_190._0_8_ = (void *)0x1df04d;
    run_test_udp_multicast_ttl_cold_9();
LAB_001df04d:
    auStack_190._0_8_ = (void *)0x1df05c;
    run_test_udp_multicast_ttl_cold_10();
  }
  puVar4 = (uv_udp_t *)local_180;
  iVar1 = (int)local_180 + 8;
  auStack_190._0_8_ = sv_send_cb;
  run_test_udp_multicast_ttl_cold_11();
  if (puVar4 == (uv_udp_t *)0x0) {
    apcStack_1a8[0] = (code *)0x1df0d9;
    sv_send_cb_cold_3();
  }
  else {
    if ((1 < iVar1 + 1U) && (iVar1 != -0x65)) goto LAB_001df0e8;
    puVar4 = (uv_udp_t *)puVar4->send_queue_count;
    auStack_190._0_8_ = ZEXT18(puVar4 == &client || puVar4 == &server);
    uStack_198 = 0;
    if ((code *)auStack_190._0_8_ != (code *)0x0) {
      sv_send_cb_called = sv_send_cb_called + 1;
      iVar1 = uv_close(puVar4,close_cb);
      return iVar1;
    }
  }
  puVar4 = (uv_udp_t *)auStack_190;
  apcStack_1a8[0] = (code *)0x1df0e8;
  sv_send_cb_cold_1();
LAB_001df0e8:
  apcStack_1a8[0] = close_cb;
  sv_send_cb_cold_2();
  bVar3 = puVar4 == &client || puVar4 == &server;
  apcStack_1a8[0] = (code *)(ulong)bVar3;
  if (apcStack_1a8[0] != (code *)0x0) {
    close_cb_called = close_cb_called + 1;
    return (int)bVar3;
  }
  ppcVar5 = apcStack_1a8;
  close_cb_cold_1();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = uv_close(ppcVar5,0);
  return iVar1;
}

Assistant:

TEST_IMPL(udp_multicast_ttl) {
  int r;
  uv_udp_send_t req;
  uv_buf_t buf;
  struct sockaddr_in addr;

  r = uv_udp_init(uv_default_loop(), &server);
  ASSERT_OK(r);

  ASSERT_OK(uv_ip4_addr("0.0.0.0", 0, &addr));
  r = uv_udp_bind(&server, (const struct sockaddr*) &addr, 0);
  ASSERT_OK(r);

  r = uv_udp_set_multicast_ttl(&server, 32);
  ASSERT_OK(r);

  /* server sends "PING" */
  buf = uv_buf_init("PING", 4);
  ASSERT_OK(uv_ip4_addr("239.255.0.1", TEST_PORT, &addr));
  r = uv_udp_send(&req,
                  &server,
                  &buf,
                  1,
                  (const struct sockaddr*) &addr,
                  sv_send_cb);
  ASSERT_OK(r);

  ASSERT_OK(close_cb_called);
  ASSERT_OK(sv_send_cb_called);

  /* run the loop till all events are processed */
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT_EQ(1, sv_send_cb_called);
  ASSERT_EQ(1, close_cb_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}